

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
PyreNet::NeuralNet::predict
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NeuralNet *this,
          vector<double,_std::allocator<double>_> *input)

{
  bool bVar1;
  size_type sVar2;
  InvalidNetworkSize *this_00;
  InvalidInputSize *this_01;
  vector<double,_std::allocator<double>_> local_60;
  reference local_48;
  Layer *l;
  iterator __end1;
  iterator __begin1;
  vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_> *__range1;
  vector<double,_std::allocator<double>_> *input_local;
  NeuralNet *this_local;
  vector<double,_std::allocator<double>_> *layerData;
  
  sVar2 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::size(&this->layers);
  if ((sVar2 != 0) && (this->inputSize != 0)) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(input);
    if (sVar2 == (long)this->inputSize) {
      std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,input);
      __end1 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::begin(&this->layers);
      l = (Layer *)std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::end(&this->layers);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
                                         *)&l), bVar1) {
        local_48 = __gnu_cxx::
                   __normal_iterator<PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
                   ::operator*(&__end1);
        Layer::calculate(&local_60,local_48,__return_storage_ptr__);
        std::vector<double,_std::allocator<double>_>::operator=(__return_storage_ptr__,&local_60);
        std::vector<double,_std::allocator<double>_>::~vector(&local_60);
        __gnu_cxx::
        __normal_iterator<PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
        ::operator++(&__end1);
      }
      return __return_storage_ptr__;
    }
    this_01 = (InvalidInputSize *)__cxa_allocate_exception(8);
    memset(this_01,0,8);
    InvalidInputSize::InvalidInputSize(this_01);
    __cxa_throw(this_01,&InvalidInputSize::typeinfo,InvalidInputSize::~InvalidInputSize);
  }
  this_00 = (InvalidNetworkSize *)__cxa_allocate_exception(8);
  memset(this_00,0,8);
  InvalidNetworkSize::InvalidNetworkSize(this_00);
  __cxa_throw(this_00,&InvalidNetworkSize::typeinfo,InvalidNetworkSize::~InvalidNetworkSize);
}

Assistant:

std::vector<double> NeuralNet::predict(const std::vector<double> &input) {
        if (this->layers.size() == 0 || this->inputSize == 0) throw InvalidNetworkSize();
        if (input.size() != this->inputSize) throw InvalidInputSize();
        std::vector<double> layerData(input);
        for (Layer &l : this->layers) {
            layerData = l.calculate(layerData);
        }
        return layerData;
    }